

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::pointer_writer<unsigned_long>&>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,
          pointer_writer<unsigned_long> *f)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  wchar_t *pwVar5;
  wchar_t *pwVar6;
  int iVar7;
  int *piVar8;
  fill_t<wchar_t> *fill;
  unsigned_long uVar9;
  ulong uVar10;
  size_t n;
  bool bVar11;
  
  iVar7 = f->num_digits;
  uVar10 = (ulong)(iVar7 + 2U);
  if ((uint)specs->width <= iVar7 + 2U) {
    puVar1 = *(undefined8 **)this;
    lVar2 = puVar1[2];
    uVar10 = lVar2 + uVar10;
    if ((ulong)puVar1[3] < uVar10) {
      (**(code **)*puVar1)(puVar1,uVar10);
      iVar7 = f->num_digits;
    }
    puVar1[2] = uVar10;
    lVar3 = puVar1[1];
    *(undefined8 *)(lVar3 + lVar2 * 4) = 0x7800000030;
    piVar8 = (int *)((long)iVar7 * 4 + lVar2 * 4 + lVar3 + 4);
    uVar9 = f->value;
    do {
      *piVar8 = (int)"0123456789abcdef"[(uint)uVar9 & 0xf];
      piVar8 = piVar8 + -1;
      bVar11 = 0xf < uVar9;
      uVar9 = uVar9 >> 4;
    } while (bVar11);
    return;
  }
  n = (uint)specs->width - uVar10;
  puVar1 = *(undefined8 **)this;
  lVar2 = puVar1[2];
  uVar10 = (specs->fill).size_ * n + uVar10 + lVar2;
  if ((ulong)puVar1[3] < uVar10) {
    (**(code **)*puVar1)(puVar1,uVar10);
  }
  puVar1[2] = uVar10;
  lVar3 = puVar1[1];
  pwVar5 = (wchar_t *)(lVar3 + lVar2 * 4);
  fill = &specs->fill;
  bVar4 = specs->field_0x9 & 0xf;
  if (bVar4 == 3) {
    pwVar6 = fill<wchar_t*,wchar_t>(pwVar5,n >> 1,fill);
    pwVar6[0] = L'0';
    pwVar6[1] = L'x';
    pwVar5 = pwVar6 + f->num_digits;
    pwVar6 = pwVar6 + (long)f->num_digits + 1;
    uVar9 = f->value;
    do {
      *pwVar6 = (int)"0123456789abcdef"[(uint)uVar9 & 0xf];
      pwVar6 = pwVar6 + -1;
      bVar11 = 0xf < uVar9;
      uVar9 = uVar9 >> 4;
    } while (bVar11);
    n = n - (n >> 1);
  }
  else {
    if (bVar4 == 2) {
      pwVar5 = fill<wchar_t*,wchar_t>(pwVar5,n,fill);
      pwVar5[0] = L'0';
      pwVar5[1] = L'x';
      pwVar5 = pwVar5 + (long)f->num_digits + 1;
      uVar9 = f->value;
      do {
        *pwVar5 = (int)"0123456789abcdef"[(uint)uVar9 & 0xf];
        pwVar5 = pwVar5 + -1;
        bVar11 = 0xf < uVar9;
        uVar9 = uVar9 >> 4;
      } while (bVar11);
      return;
    }
    *(undefined8 *)(lVar3 + lVar2 * 4) = 0x7800000030;
    pwVar5 = pwVar5 + f->num_digits;
    piVar8 = (int *)(lVar3 + (long)f->num_digits * 4 + lVar2 * 4 + 4);
    uVar9 = f->value;
    do {
      *piVar8 = (int)"0123456789abcdef"[(uint)uVar9 & 0xf];
      piVar8 = piVar8 + -1;
      bVar11 = 0xf < uVar9;
      uVar9 = uVar9 >> 4;
    } while (bVar11);
  }
  fill<wchar_t*,wchar_t>(pwVar5 + 2,n,fill);
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    size_t padding = width - num_code_points;
    size_t fill_size = specs.fill.size();
    auto&& it = reserve(size + padding * fill_size);
    if (specs.align == align::right) {
      it = fill(it, padding, specs.fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = fill(it, left_padding, specs.fill);
      f(it);
      it = fill(it, padding - left_padding, specs.fill);
    } else {
      f(it);
      it = fill(it, padding, specs.fill);
    }
  }